

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer.cpp
# Opt level: O0

MPP_RET mpp_buffer_set_offset_with_caller(MppBuffer buffer,size_t offset,char *caller)

{
  MppBufferImpl *p;
  char *caller_local;
  size_t offset_local;
  MppBuffer buffer_local;
  
  if (buffer == (MppBuffer)0x0) {
    _mpp_log_l(2,"mpp_buffer","mpp_buffer_set_offset invalid NULL input from %s\n",(char *)0x0,
               caller);
    buffer_local._4_4_ = MPP_ERR_UNKNOW;
  }
  else {
    *(size_t *)((long)buffer + 0xa8) = offset;
    buffer_local._4_4_ = MPP_OK;
  }
  return buffer_local._4_4_;
}

Assistant:

MPP_RET mpp_buffer_set_offset_with_caller(MppBuffer buffer, size_t offset, const char *caller)
{
    if (NULL == buffer) {
        mpp_err("mpp_buffer_set_offset invalid NULL input from %s\n", caller);
        return MPP_ERR_UNKNOW;
    }

    MppBufferImpl *p = (MppBufferImpl*)buffer;
    p->offset = offset;
    return MPP_OK;
}